

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O1

uint64_t __thiscall pbrt::Hash<int,pbrt::Vector3<float>>(pbrt *this,int args,Vector3<float> args_1)

{
  ulong uVar1;
  
  uVar1 = args_1.super_Tuple3<pbrt::Vector3,_float>._0_8_ * -0x395b586ca42e166b;
  uVar1 = (uVar1 >> 0x2f ^ uVar1) * -0x395b586ca42e166b;
  uVar1 = (CONCAT44((int)(uVar1 >> 0x20),args_1.super_Tuple3<pbrt::Vector3,_float>.z) ^
          (uVar1 ^ 0x4fb7dae84dd6f2fc) * -0x395b586ca42e166b) * -0x395b586ca42e166b;
  uVar1 = (uVar1 >> 0x2f ^ uVar1) * -0x395b586ca42e166b;
  uVar1 = (uVar1 ^ (uint)this & 0xffffff ^ 0x1a929e4d6f47a654 ^
          ((ulong)((uint)this & 0xff000000) | uVar1 >> 0x2f)) * -0x395b586ca42e166b;
  uVar1 = (uVar1 >> 0x2f ^ uVar1) * -0x395b586ca42e166b;
  return uVar1 >> 0x2f ^ uVar1;
}

Assistant:

PBRT_CPU_GPU
inline uint64_t MurmurHash64A(const void *key, int len, uint64_t seed) {
    const uint64_t m = 0xc6a4a7935bd1e995ull;
    const int r = 47;

    uint64_t h = seed ^ (len * m);

    const uint64_t *data = (const uint64_t *)key;
    const uint64_t *end = data + (len / 8);

    while (data != end) {
        uint64_t k = *data++;

        k *= m;
        k ^= k >> r;
        k *= m;

        h ^= k;
        h *= m;
    }

    const unsigned char *data2 = (const unsigned char *)data;

    switch (len & 7) {
    case 7:
        h ^= uint64_t(data2[6]) << 48;
    case 6:
        h ^= uint64_t(data2[5]) << 40;
    case 5:
        h ^= uint64_t(data2[4]) << 32;
    case 4:
        h ^= uint64_t(data2[3]) << 24;
    case 3:
        h ^= uint64_t(data2[2]) << 16;
    case 2:
        h ^= uint64_t(data2[1]) << 8;
    case 1:
        h ^= uint64_t(data2[0]);
        h *= m;
    };

    h ^= h >> r;
    h *= m;
    h ^= h >> r;

    return h;
}